

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O0

void * c74::max::outlet_single<long_long>(t_ptr_int outlet_id,longlong value)

{
  bool bVar1;
  pointer ppVar2;
  reference this;
  t_ptr_int tVar3;
  t_mock_outlet *outlet;
  __normal_iterator<c74::max::t_mock_outlet_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>
  local_38;
  t_mock_outlet_iter j;
  t_mock_outlets *outletset;
  _Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
  local_20;
  iterator i;
  longlong value_local;
  t_ptr_int outlet_id_local;
  
  i.
  super__Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
             )(_Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
               )value;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
       ::begin((unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
                *)g_object_to_outletset);
  do {
    outletset = (t_mock_outlets *)
                std::
                unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
                ::end((unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
                       *)g_object_to_outletset);
    bVar1 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
                        *)&outletset);
    if (!bVar1) {
      return (void *)0x1;
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false,_false>
                           *)&local_20);
    j._M_current = (t_mock_outlet *)&ppVar2->second;
    local_38._M_current =
         (t_mock_outlet *)
         std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::begin
                   ((vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_> *)
                    j._M_current);
    while( true ) {
      outlet = (t_mock_outlet *)
               std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::end
                         (j._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<c74::max::t_mock_outlet_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>
                          *)&outlet);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<c74::max::t_mock_outlet_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>
             ::operator*(&local_38);
      tVar3 = t_mock_outlet::get_id(this);
      if (tVar3 == outlet_id) {
        t_mock_outlet::push(this,(t_atom_long)
                                 i.
                                 super__Node_iterator_base<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false>
                                 ._M_cur);
        return (void *)0x1;
      }
      __gnu_cxx::
      __normal_iterator<c74::max::t_mock_outlet_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>
      ::operator++(&local_38,0);
    }
    std::__detail::
    _Node_iterator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>,_false,_false>
                  *)&local_20,0);
  } while( true );
}

Assistant:

void *outlet_single(t_ptr_int outlet_id, T value)
{
    for (t_map_object_2_outlet_set::iterator i = g_object_to_outletset.begin(); i != g_object_to_outletset.end(); i++) {
        t_mock_outlets& outletset = i->second;

        for (t_mock_outlet_iter j = outletset.begin(); j != outletset.end(); j++) {
            t_mock_outlet& outlet = *j;

            if (outlet.get_id() == outlet_id) {
                outlet.push(value);
                goto done;
            }
        }
    }
done:
    return (void*)1;
}